

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralPlanarActionVarying::IfcStructuralPlanarActionVarying
          (IfcStructuralPlanarActionVarying *this)

{
  *(undefined ***)&this->field_0x1d8 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x1e0 = 0;
  *(char **)&this->field_0x1e8 = "IfcStructuralPlanarActionVarying";
  IfcStructuralPlanarAction::IfcStructuralPlanarAction
            (&this->super_IfcStructuralPlanarAction,&PTR_construction_vtable_24__007c4af0);
  *(undefined8 *)&(this->super_IfcStructuralPlanarAction).field_0x1b0 = 0;
  *(undefined8 *)
   &(this->super_IfcStructuralPlanarAction).super_IfcStructuralAction.super_IfcStructuralActivity.
    super_IfcProduct.super_IfcObject = 0x7c4998;
  *(undefined8 *)&this->field_0x1d8 = 0x7c4ad8;
  *(undefined8 *)
   &(this->super_IfcStructuralPlanarAction).super_IfcStructuralAction.super_IfcStructuralActivity.
    super_IfcProduct.super_IfcObject.field_0x88 = 0x7c49c0;
  (this->super_IfcStructuralPlanarAction).super_IfcStructuralAction.super_IfcStructuralActivity.
  super_IfcProduct.super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0x7c49e8;
  *(undefined8 *)
   &(this->super_IfcStructuralPlanarAction).super_IfcStructuralAction.super_IfcStructuralActivity.
    super_IfcProduct.super_IfcObject.field_0xd0 = 0x7c4a10;
  *(undefined8 *)
   &(this->super_IfcStructuralPlanarAction).super_IfcStructuralAction.super_IfcStructuralActivity.
    super_IfcProduct.field_0x100 = 0x7c4a38;
  *(undefined8 *)
   &(this->super_IfcStructuralPlanarAction).super_IfcStructuralAction.super_IfcStructuralActivity.
    field_0x138 = 0x7c4a60;
  *(undefined8 *)&(this->super_IfcStructuralPlanarAction).super_IfcStructuralAction.field_0x178 =
       0x7c4a88;
  *(undefined8 *)&(this->super_IfcStructuralPlanarAction).field_0x1a8 = 0x7c4ab0;
  *(undefined8 *)&(this->super_IfcStructuralPlanarAction).field_0x1b8 = 0;
  (this->SubsequentAppliedLoads).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SubsequentAppliedLoads).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SubsequentAppliedLoads).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

IfcStructuralPlanarActionVarying() : Object("IfcStructuralPlanarActionVarying") {}